

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  OutputInfo *pOVar1;
  string sStack_38;
  
  if (this->Target->IsImportedTarget == true) {
    cmTarget::ImportedGetFullPath(&sStack_38,this->Target,config,artifact);
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    return __return_storage_ptr__;
  }
  pOVar1 = GetOutputInfo(this,config);
  if (pOVar1 == (OutputInfo *)0x0) {
LAB_003f11b9:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_38);
  }
  else {
    if (artifact == ImportLibraryArtifact) {
      pOVar1 = (OutputInfo *)&pOVar1->ImpDir;
    }
    else if (artifact != RuntimeBinaryArtifact) goto LAB_003f11b9;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pOVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDirectory(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    // Return the directory from which the target is imported.
    return cmSystemTools::GetFilenamePath(
      this->Target->ImportedGetFullPath(config, artifact));
  }
  if (OutputInfo const* info = this->GetOutputInfo(config)) {
    // Return the directory in which the target will be built.
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        return info->OutDir;
      case cmStateEnums::ImportLibraryArtifact:
        return info->ImpDir;
    }
  }
  return "";
}